

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O0

int Map_LibraryReadFileTreeStr
              (Map_SuperLib_t *pLib,Mio_Library_t *pGenlib,Vec_Str_t *vStr,char *pFileName)

{
  int iVar1;
  char *pcVar2;
  Map_Super_t **ppMVar3;
  ProgressBar *p;
  bool bVar4;
  int local_13f4;
  int local_13f0;
  int nPos;
  int RetValue;
  int i;
  int k;
  int nCounter;
  char *pLibName;
  char *pTemp;
  Map_Super_t *pGate;
  char pBuffer [5000];
  ProgressBar *pProgress;
  char *pFileName_local;
  Vec_Str_t *vStr_local;
  Mio_Library_t *pGenlib_local;
  Map_SuperLib_t *pLib_local;
  
  pLibName = (char *)0x0;
  local_13f4 = 0;
  do {
    local_13f0 = Vec_StrGets((char *)&pGate,5000,vStr,&local_13f4);
    if (local_13f0 == 0) {
      return 0;
    }
    pLibName = (char *)&pGate;
    while( true ) {
      bVar4 = true;
      if ((*pLibName != ' ') && (bVar4 = true, *pLibName != '\r')) {
        bVar4 = *pLibName == '\n';
      }
      if (!bVar4) break;
      pLibName = pLibName + 1;
    }
  } while ((*pLibName == '\0') || (*pLibName == '#'));
  _k = strtok(pLibName," \t\r\n");
  pLib->pGenlib = pGenlib;
  if (pLib->pGenlib != (Mio_Library_t *)0x0) {
    pcVar2 = Mio_LibraryReadName(pLib->pGenlib);
    iVar1 = Map_LibraryCompareLibNames(pcVar2,_k);
    if (iVar1 == 0) {
      local_13f0 = Vec_StrGets((char *)&pGate,5000,vStr,&local_13f4);
      if (local_13f0 == 0) {
        return 0;
      }
      local_13f0 = __isoc99_sscanf(&pGate,"%d\n",&pLib->nVarsMax);
      if ((pLib->nVarsMax < 2) || (10 < pLib->nVarsMax)) {
        printf("Suspicious number of variables (%d).\n",(ulong)(uint)pLib->nVarsMax);
        return 0;
      }
      local_13f0 = Vec_StrGets((char *)&pGate,5000,vStr,&local_13f4);
      if (local_13f0 == 0) {
        return 0;
      }
      local_13f0 = __isoc99_sscanf(&pGate,"%d\n",&pLib->nSupersReal);
      if ((0 < pLib->nSupersReal) && (pLib->nSupersReal < 0x989681)) {
        local_13f0 = Vec_StrGets((char *)&pGate,5000,vStr,&local_13f4);
        if (local_13f0 == 0) {
          return 0;
        }
        local_13f0 = __isoc99_sscanf(&pGate,"%d\n",&pLib->nLines);
        if ((0 < pLib->nLines) && (pLib->nLines < 0x989681)) {
          ppMVar3 = (Map_Super_t **)malloc((long)(pLib->nLines + 10000) << 3);
          pLib->ppSupers = ppMVar3;
          for (nPos = 0; nPos < pLib->nVarsMax; nPos = nPos + 1) {
            pTemp = Extra_MmFixedEntryFetch(pLib->mmSupers);
            memset(pTemp,0,0x100);
            *(int *)pTemp = nPos;
            *(uint *)(pTemp + 0x48) = pLib->uTruths[nPos][0];
            *(uint *)(pTemp + 0x4c) = pLib->uTruths[nPos][1];
            for (RetValue = 0; RetValue < pLib->nVarsMax; RetValue = RetValue + 1) {
              pcVar2 = pTemp + (long)RetValue * 0xc + 0x54;
              pcVar2[0] = '\0';
              pcVar2[1] = '<';
              pcVar2[2] = '\x1c';
              pcVar2[3] = -0x3a;
              pcVar2 = pTemp + (long)RetValue * 0xc + 0x50;
              pcVar2[0] = '\0';
              pcVar2[1] = '<';
              pcVar2[2] = '\x1c';
              pcVar2[3] = -0x3a;
              pcVar2 = pTemp + (long)RetValue * 0xc + 0x9c;
              pcVar2[0] = '\0';
              pcVar2[1] = '<';
              pcVar2[2] = '\x1c';
              pcVar2[3] = -0x3a;
              pcVar2 = pTemp + (long)RetValue * 0xc + 0x98;
              pcVar2[0] = '\0';
              pcVar2[1] = '<';
              pcVar2[2] = '\x1c';
              pcVar2[3] = -0x3a;
            }
            pcVar2 = pTemp + (long)nPos * 0xc + 0x50;
            pcVar2[0] = '\0';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pcVar2 = pTemp + (long)nPos * 0xc + 0x9c;
            pcVar2[0] = '\0';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
            pLib->ppSupers[nPos] = (Map_Super_t *)pTemp;
          }
          i = pLib->nVarsMax;
          p = Extra_ProgressBarStart(_stdout,pLib->nLines);
          while( true ) {
            do {
              iVar1 = Vec_StrGets((char *)&pGate,5000,vStr,&local_13f4);
              if (iVar1 == 0) {
                Extra_ProgressBarStop(p);
                if (i != pLib->nLines) {
                  printf("The number of lines read (%d) is different from what the file says (%d).\n"
                         ,(ulong)(uint)i,(ulong)(uint)pLib->nLines);
                }
                pLib->nSupersAll = i;
                i = 0;
                for (RetValue = 0; RetValue < pLib->nLines; RetValue = RetValue + 1) {
                  i = (*(uint *)&pLib->ppSupers[RetValue]->field_0x4 & 1) + i;
                }
                if (i != pLib->nSupersReal) {
                  printf("The number of gates read (%d) is different what the file says (%d).\n",
                         (ulong)(uint)i,(ulong)(uint)pLib->nSupersReal);
                }
                pLib->nSupersReal = i;
                return 1;
              }
              pLibName = (char *)&pGate;
              while( true ) {
                bVar4 = true;
                if ((*pLibName != ' ') && (bVar4 = true, *pLibName != '\r')) {
                  bVar4 = *pLibName == '\n';
                }
                if (!bVar4) break;
                pLibName = pLibName + 1;
              }
            } while (*pLibName == '\0');
            pTemp = (char *)Map_LibraryReadGateTree(pLib,pLibName,i,pLib->nVarsMax);
            if ((Map_Super_t *)pTemp == (Map_Super_t *)0x0) break;
            iVar1 = i + 1;
            pLib->ppSupers[i] = (Map_Super_t *)pTemp;
            i = iVar1;
            Extra_ProgressBarUpdate(p,iVar1,(char *)0x0);
          }
          Extra_ProgressBarStop(p);
          return 0;
        }
        printf("Suspicious number of lines (%d).\n",(ulong)(uint)pLib->nLines);
        return 0;
      }
      printf("Suspicious number of gates (%d).\n",(ulong)(uint)pLib->nSupersReal);
      return 0;
    }
  }
  printf("Supergate library \"%s\" requires the use of genlib library \"%s\".\n",pFileName,_k);
  return 0;
}

Assistant:

int Map_LibraryReadFileTreeStr( Map_SuperLib_t * pLib, Mio_Library_t * pGenlib, Vec_Str_t * vStr, char * pFileName )
{
    ProgressBar * pProgress;
    char pBuffer[5000];
    Map_Super_t * pGate;
    char * pTemp = 0, * pLibName;
    int nCounter, k, i;
    int RetValue, nPos = 0;

    // skip empty and comment lines
//    while ( fgets( pBuffer, 5000, pFile ) != NULL )
    while ( 1 )
    {
        RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
        if ( RetValue == 0 )
            return 0;
        // skip leading spaces
        for ( pTemp = pBuffer; *pTemp == ' ' || *pTemp == '\r' || *pTemp == '\n'; pTemp++ );
        // skip comment lines and empty lines
        if ( *pTemp != 0 && *pTemp != '#' )
            break;
    }

    pLibName = strtok( pTemp, " \t\r\n" );
//    pLib->pGenlib = (Mio_Library_t *)Abc_FrameReadLibGen();
    pLib->pGenlib = pGenlib;
//    if ( pLib->pGenlib == NULL || strcmp( , pLibName ) )
    if ( pLib->pGenlib == NULL || Map_LibraryCompareLibNames(Mio_LibraryReadName(pLib->pGenlib), pLibName) )
    {
        printf( "Supergate library \"%s\" requires the use of genlib library \"%s\".\n", pFileName, pLibName );
        return 0;
    }

    // read the number of variables
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nVarsMax );
    if ( pLib->nVarsMax < 2 || pLib->nVarsMax > 10 )
    {
        printf( "Suspicious number of variables (%d).\n", pLib->nVarsMax );
        return 0;
    }

    // read the number of gates
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nSupersReal );
    if ( pLib->nSupersReal < 1 || pLib->nSupersReal > 10000000 )
    {
        printf( "Suspicious number of gates (%d).\n", pLib->nSupersReal );
        return 0;
    }

    // read the number of lines
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nLines );
    if ( pLib->nLines < 1 || pLib->nLines > 10000000 )
    {
        printf( "Suspicious number of lines (%d).\n", pLib->nLines );
        return 0;
    }

    // allocate room for supergate pointers
    pLib->ppSupers = ABC_ALLOC( Map_Super_t *, pLib->nLines + 10000 );

    // create the elementary supergates
    for ( i = 0; i < pLib->nVarsMax; i++ )
    {
        // get a new gate
        pGate = (Map_Super_t *)Extra_MmFixedEntryFetch( pLib->mmSupers );
        memset( pGate, 0, sizeof(Map_Super_t) );
        // assign the elementary variable, the truth table, and the delays
        pGate->Num = i;
        // set the truth table
        pGate->uTruth[0] = pLib->uTruths[i][0];
        pGate->uTruth[1] = pLib->uTruths[i][1];
        // set the arrival times of all input to non-existent delay
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            pGate->tDelaysR[k].Rise = pGate->tDelaysR[k].Fall = MAP_NO_VAR;
            pGate->tDelaysF[k].Rise = pGate->tDelaysF[k].Fall = MAP_NO_VAR;
        }
        // set an existent arrival time for rise and fall
        pGate->tDelaysR[i].Rise = 0.0;
        pGate->tDelaysF[i].Fall = 0.0;
        // set the gate
        pLib->ppSupers[i] = pGate;
    }

    // read the lines
    nCounter = pLib->nVarsMax;
    pProgress = Extra_ProgressBarStart( stdout, pLib->nLines );
//    while ( fgets( pBuffer, 5000, pFile ) != NULL )
    while ( Vec_StrGets( pBuffer, 5000, vStr, &nPos ) )
    {
        for ( pTemp = pBuffer; *pTemp == ' ' || *pTemp == '\r' || *pTemp == '\n'; pTemp++ );
        if ( pTemp[0] == '\0' )
            continue;
//        if ( pTemp[0] == 'a' || pTemp[2] == 'a' )
//        {
//            pLib->nLines--;
//            continue;
//        }

        // get the gate
        pGate = Map_LibraryReadGateTree( pLib, pTemp, nCounter, pLib->nVarsMax );
        if ( pGate == NULL )
        {
            Extra_ProgressBarStop( pProgress );
            return 0;
        }
        pLib->ppSupers[nCounter++] = pGate;
        // later we will derive: truth table, delays, area, number of component gates, etc

        // update the progress bar
        Extra_ProgressBarUpdate( pProgress, nCounter, NULL );
    }
    Extra_ProgressBarStop( pProgress );
    if ( nCounter != pLib->nLines )
        printf( "The number of lines read (%d) is different from what the file says (%d).\n", nCounter, pLib->nLines );
    pLib->nSupersAll = nCounter;
    // count the number of real supergates
    nCounter = 0;
    for ( k = 0; k < pLib->nLines; k++ )
        nCounter += pLib->ppSupers[k]->fSuper;
    if ( nCounter != pLib->nSupersReal )
        printf( "The number of gates read (%d) is different what the file says (%d).\n", nCounter, pLib->nSupersReal );
    pLib->nSupersReal = nCounter;
    return 1;
}